

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O0

void operator_delete(void *p,size_t size,align_val_t val)

{
  code *pcVar1;
  bool bVar2;
  MetaEntryBase *this;
  conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *pcVar3;
  Alloc<void> p_00;
  size_t sVar4;
  alloc_id_t target_id;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *in_RDX;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *this_00;
  long in_RSI;
  void *in_RDI;
  undefined8 *in_FS_OFFSET;
  size_t result;
  PagemapEntry *entry_1;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  p_tame;
  AllocWild<void> p_wild;
  CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  cp;
  SlabMetadata *meta;
  bool result_1;
  int64_t size_1;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  r;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *entry_2;
  size_t pm_size;
  size_t rsize;
  sizeclass_t pm_sc;
  sizeclass_t sc;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *entry;
  address_t in_stack_fffffffffffffa38;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *in_stack_fffffffffffffa40;
  LocalEntropy *in_stack_fffffffffffffa50;
  address_t in_stack_fffffffffffffa58;
  Alloc<RemoteMessage> msg;
  sizeclass_t in_stack_fffffffffffffa60;
  sizeclass_t sizeclass;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  n;
  undefined7 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa7f;
  sizeclass_t in_stack_fffffffffffffa80;
  Alloc<void> p_01;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_538;
  void *local_4f8;
  void *local_4f0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_4e0;
  void **local_4d8;
  void *local_4c8;
  void *local_4c0;
  void *local_4b8;
  void *local_4b0;
  size_t local_4a8;
  ulong local_4a0;
  MetaEntryBase *local_498;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_490;
  void *local_488;
  char *local_480;
  undefined1 local_471;
  char **local_470;
  MetaEntryBase *local_468;
  MetaEntryBase *local_460;
  ulong local_458;
  ulong local_450;
  MetaEntryBase *local_448;
  ulong local_440;
  MetaEntryBase *local_438;
  size_t local_430;
  MetaEntryBase *local_428;
  void *local_420;
  void **local_418;
  void *local_410;
  void *local_408;
  void **local_400;
  ulong local_3f0;
  ulong local_3e8;
  void **local_3d8;
  void *local_3d0;
  void *local_3c8;
  undefined1 local_3c0 [8];
  void *local_3b8;
  undefined1 *local_3b0;
  LocalState *local_398;
  void *local_390;
  void *local_388;
  LocalState **local_380;
  undefined1 local_370 [16];
  undefined1 *local_360;
  void *local_358;
  undefined8 local_350;
  void *local_348;
  void *local_340;
  MetaEntryBase *local_338;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_330;
  void *local_328;
  void **local_320;
  void **local_318;
  void **local_310;
  char *local_308;
  byte local_2f9;
  char **local_2f8;
  undefined8 *local_2f0;
  void **local_2e8;
  undefined8 local_2e0;
  undefined8 *local_2d8;
  MetaEntryBase *local_2d0;
  undefined1 local_2c1;
  size_t local_2c0;
  long local_2b8;
  undefined2 local_2aa;
  MetaEntryBase *local_2a8;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_2a0;
  ulong local_298;
  MetaEntryBase *local_290;
  size_t local_288;
  MetaEntryBase *local_280;
  void *local_278;
  void *local_270 [2];
  undefined1 local_260 [16];
  undefined1 *local_250;
  void **local_248;
  void **local_240;
  void **local_238;
  void **local_230;
  MetaEntryBase *local_228;
  MetaEntryBase *local_220;
  ulong local_218;
  MetaEntryBase *local_210;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_208;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_200;
  void *local_1f8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_1f0;
  long local_1e8;
  ulong local_1e0;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_1d8;
  void *local_1d0;
  void *local_1c8;
  char *local_1c0;
  undefined1 local_1b1;
  char **local_1b0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_1a8;
  SingletonRemoteMessage *local_1a0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_198;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_190;
  long local_188;
  ulong local_180;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_178;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_170;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_168;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_160;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_158;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_150;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_148;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_140;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_138;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_130;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_128;
  undefined1 local_120 [8];
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_118;
  undefined1 *local_110;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_108;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_100;
  ulong local_f8;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_f0
  ;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_e8;
  long *local_e0;
  size_t local_d8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  size_t local_b8;
  sizeclass_t local_b0;
  sizeclass_t local_a8;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_a0
  ;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_98;
  void *local_90;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_78
  ;
  size_t local_70;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_68
  ;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_58
  ;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_50
  ;
  ulong local_48;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_40
  ;
  size_t local_38;
  size_t local_30;
  char *local_28;
  undefined1 local_19;
  size_t *local_18;
  size_t *local_10;
  char **local_8;
  
  local_538 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
              (((ulong)&in_RDX[-1].field_0x2aff | in_RSI - 1U) + 1);
  bVar2 = snmalloc::is_small_sizeclass((size_t)in_stack_fffffffffffffa40);
  if (((!bVar2) &&
      (local_538 ==
       (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)0x0))
     && (in_RSI != 0)) {
    local_538 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                 *)0xffffffffffffffff;
  }
  local_98 = local_538;
  p_01.unsafe_capptr = in_RDI;
  local_90 = in_RDI;
  local_a0 = snmalloc::
             FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
             ::get<false>(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  local_48 = (local_a0->
             super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
             ).super_MetaEntryBase.remote_and_sizeclass;
  local_58 = local_a0;
  local_50 = local_a0;
  local_40 = local_a0;
  if ((local_48 & 0xffffffffffffff80) != 0) {
    in_stack_fffffffffffffa80.value = (size_t)local_98;
    if (local_98 ==
        (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)0x0) {
      in_stack_fffffffffffffa80.value = 1;
    }
    local_98 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *
               )in_stack_fffffffffffffa80.value;
    local_a8 = snmalloc::size_to_sizeclass_full(0x1498c5);
    local_78 = local_a0;
    local_68 = local_a0;
    local_b0 = snmalloc::sizeclass_t::from_raw(in_stack_fffffffffffffa38);
    local_c0 = local_a8.value;
    local_70 = local_b0.value;
    local_b8 = snmalloc::sizeclass_full_to_size(in_stack_fffffffffffffa60);
    local_d0 = local_b0.value;
    local_c8 = snmalloc::sizeclass_full_to_size(in_stack_fffffffffffffa60);
    local_d8 = local_b0.value;
    bVar2 = snmalloc::sizeclass_t::operator==(&local_a8,local_b0);
    in_stack_fffffffffffffa7f = bVar2 || local_90 == (void *)0x0;
    local_28 = "Dealloc rounded size mismatch: {} != {}";
    local_30 = local_b8;
    local_38 = local_c8;
    local_19 = in_stack_fffffffffffffa7f;
    if (!bVar2 && local_90 != (void *)0x0) {
      local_8 = &local_28;
      local_10 = &local_30;
      local_18 = &local_38;
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  sizeclass.value = *(undefined8 *)*in_FS_OFFSET;
  local_250 = local_260;
  local_4f0 = in_RDI;
  local_4e0 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
              sizeclass.value;
  local_398 = snmalloc::
              Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
              backend_state_ptr((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                                 *)sizeclass.value);
  local_390 = local_4f0;
  local_380 = &local_398;
  local_248 = &local_390;
  local_360 = local_370;
  local_388 = local_4f0;
  local_4f8 = local_4f0;
  local_408 = local_4f0;
  local_400 = &local_408;
  this = (MetaEntryBase *)
         snmalloc::
         FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
         ::get<false>(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  pcVar3 = snmalloc::
           Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
           public_state((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                         *)sizeclass.value);
  local_450 = this->remote_and_sizeclass;
  local_468 = this;
  local_448 = this;
  if (pcVar3 == (conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *)
                (local_450 & 0xffffffffffffff80)) {
    local_4d8 = &local_4f8;
    local_358 = local_4f8;
    local_230 = &local_358;
    local_488 = local_4f8;
    local_4a0 = this->meta & 0xfffffffffffffffe;
    n.unsafe_capptr =
         (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
          *)sizeclass.value;
    local_498 = this;
    local_490 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                 *)sizeclass.value;
    local_460 = this;
    local_440 = local_4a0;
    local_438 = this;
    local_428 = this;
    local_4a8 = (size_t)snmalloc::sizeclass_t::from_raw(in_stack_fffffffffffffa38);
    local_4b0 = local_488;
    local_420 = local_488;
    local_418 = &local_420;
    local_410 = local_488;
    local_430 = local_4a8;
    local_471 = snmalloc::is_start_of_object
                          (in_stack_fffffffffffffa80,
                           CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78));
    local_480 = "Not deallocating start of an object";
    if (((local_471 ^ 0xff) & 1) != 0) {
      local_470 = &local_480;
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_3d8 = &local_488;
    local_3c8 = local_488;
    local_3b0 = local_3c0;
    local_3d0 = local_488;
    local_4b8 = local_488;
    local_4c0 = local_488;
    local_458 = local_4a0;
    local_3e8 = local_4a0;
    local_3f0 = local_4a0;
    local_3b8 = local_3c8;
    snmalloc::freelist::
    Builder<true,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
    ::add((Builder<true,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
           *)sizeclass.value,n,(FreeListKey *)in_stack_fffffffffffffa60.value,
          in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
    bVar2 = snmalloc::
            FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
            ::return_object((FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                             *)0x149eec);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_4c8 = local_488;
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_local_object_slow
                (in_RDX,(Alloc<void>)local_538,(PagemapEntry *)in_stack_fffffffffffffa80.value,
                 (BackendSlabMetadata *)
                 CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78));
    }
  }
  else {
    local_328 = local_4f8;
    local_218 = this->remote_and_sizeclass;
    local_338 = this;
    local_330 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                 *)sizeclass.value;
    local_228 = this;
    local_220 = this;
    local_210 = this;
    if ((local_218 & 0xffffffffffffff80) == 0) {
      local_2d8 = &local_350;
      local_2e0 = 0;
      local_350 = 0;
      local_2e8 = &local_328;
      local_2f0 = &local_350;
      if (local_4f8 != (void *)0x0) {
        local_318 = &local_328;
        local_278 = local_4f8;
        local_238 = &local_278;
        local_320 = &local_328;
        local_1c8 = local_4f8;
        local_1b1 = local_4f8 == (void *)0x0;
        local_1c0 = "Not allocated by snmalloc.";
        if (!(bool)local_1b1) {
          local_1b0 = &local_1c0;
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
    }
    else {
      local_310 = &local_328;
      local_270[0] = local_4f8;
      local_240 = local_270;
      bVar2 = snmalloc::MetaEntryBase::is_backend_owned(this);
      local_2f9 = (bVar2 ^ 0xffU) & 1;
      local_308 = "Memory corruption detected";
      if (((local_2f9 ^ 0xff) & 1) != 0) {
        local_2f8 = &local_308;
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      msg.unsafe_capptr =
           (SingletonRemoteMessage *)
           &((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
            sizeclass.value)->remote_dealloc_cache;
      local_2a8 = local_338;
      local_2aa = 1;
      p_00.unsafe_capptr = (void *)0x1;
      local_290 = local_338;
      local_280 = local_338;
      local_2a0 = (RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                   *)msg.unsafe_capptr;
      local_2c0 = (size_t)snmalloc::sizeclass_t::from_raw(in_stack_fffffffffffffa38);
      local_288 = local_2c0;
      sVar4 = snmalloc::sizeclass_full_to_size(sizeclass);
      local_2b8 = (long)p_00.unsafe_capptr * sVar4;
      local_2c1 = local_2b8 <
                  ((RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                    *)msg.unsafe_capptr)->capacity;
      if ((bool)local_2c1) {
        ((RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
          *)msg.unsafe_capptr)->capacity =
             ((RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
               *)msg.unsafe_capptr)->capacity - local_2b8;
        this_00 = (FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
                   *)(sizeclass.value + 0x420);
        local_2d0 = local_338;
        local_298 = local_338->meta & 0xfffffffffffffffe;
        local_340 = local_328;
        local_1e8 = sizeclass.value + 0x2048;
        local_1d0 = local_328;
        local_1f8 = local_328;
        local_1e0 = local_298;
        local_1d8 = this_00;
        local_200 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                     *)snmalloc::freelist::Object::
                       make<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
                                 ((CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
                                   )p_00.unsafe_capptr);
        local_178 = this_00 + 0xc0;
        local_180 = local_1e0;
        local_188 = local_1e8;
        local_e0 = &local_188;
        local_158 = &local_160;
        local_208 = this_00;
        local_1f0 = local_200;
        local_198 = local_200;
        local_170 = this_00;
        local_168 = local_200;
        local_160 = local_200;
        local_150 = local_200;
        local_108 = local_200;
        local_e8 = local_200;
        local_190 = snmalloc::
                    FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
                    ::get<false>(this_00,in_stack_fffffffffffffa38);
        local_f8 = (local_190->
                   super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                   ).super_MetaEntryBase.remote_and_sizeclass;
        local_100 = local_190;
        local_f0 = local_190;
        target_id = snmalloc::RemoteAllocator::trunc_id
                              ((RemoteAllocator *)(local_f8 & 0xffffffffffffff80));
        local_148 = &local_168;
        local_128 = local_168;
        local_110 = local_120;
        local_130 = local_168;
        local_140 = local_168;
        local_1a8 = local_168;
        local_138 = local_148;
        local_118 = local_128;
        local_1a0 = (SingletonRemoteMessage *)
                    snmalloc::SingletonRemoteMessage::emplace_in_alloc(p_00);
        snmalloc::
        RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
        ::dealloc<11008UL>::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)p_00.unsafe_capptr,target_id,msg);
      }
      else {
        local_348 = local_328;
        snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
        ::dealloc_remote_slow<snmalloc::CheckInitPthread>(local_538,(PagemapEntry *)in_RDX,p_01);
      }
    }
  }
  return;
}

Assistant:

void operator delete(void* p, size_t size, std::align_val_t val) EXCEPTSPEC
{
  size = snmalloc::aligned_size(size_t(val), size);
  snmalloc::libc::free_sized(p, size);
}